

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

Func * __thiscall wabt::Module::GetFunc(Module *this,Var *var)

{
  Func *pFVar1;
  Var *var_local;
  Module *this_local;
  
  pFVar1 = GetFunc(this,var);
  return pFVar1;
}

Assistant:

const Func* Module::GetFunc(const Var& var) const {
  return const_cast<Module*>(this)->GetFunc(var);
}